

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O1

void __thiscall
CircularArrayTest_const_front_Test::TestBody(CircularArrayTest_const_front_Test *this)

{
  int line;
  long lVar1;
  char *message;
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  Message local_58;
  undefined1 local_50 [16];
  AssertHelper local_40;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_38;
  
  lVar1 = 0;
  do {
    (&local_38.contents_._M_elems[0].moved)[lVar1] = false;
    *(undefined8 *)((long)&local_38.contents_._M_elems[0].data + lVar1) = 0;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x18);
  local_38.size_ = 0;
  local_38.front_ = 0;
  local_50._0_4_ = 1;
  local_50._4_4_ = 0;
  local_50[8] = false;
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 3;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            (&local_38,(value_type *)local_50);
  (anonymous_namespace)::TestObject::destruct_count =
       (anonymous_namespace)::TestObject::destruct_count + 1;
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  if (local_38.size_ == 0) {
LAB_00142f9c:
    local_58.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    __assert_fail("index < size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                  ,0x39,
                  "const_reference wabt::CircularArray<(anonymous namespace)::TestObject, 2>::at(size_type) const [T = (anonymous namespace)::TestObject, kCapacity = 2]"
                 );
  }
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_50,"1","cca.front().data",(int *)&local_58,
             &local_38.contents_._M_elems[(uint)local_38.front_ & 1].data);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
    }
    line = 0xd1;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_50._9_7_,local_50[8]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_50 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_50._9_7_,local_50[8]));
    }
    local_50._0_4_ = 2;
    local_50._4_4_ = 0;
    local_50[8] = false;
    (anonymous_namespace)::TestObject::construct_count =
         (anonymous_namespace)::TestObject::construct_count + 1;
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              (&local_38,(value_type *)local_50);
    (anonymous_namespace)::TestObject::destruct_count =
         (anonymous_namespace)::TestObject::destruct_count + 1;
    local_58.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    if (local_38.size_ == 0) goto LAB_00142f9c;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_50,"1","cca.front().data",(int *)&local_58,
               &local_38.contents_._M_elems[(uint)local_38.front_ & 1].data);
    if (local_50[0] != (internal)0x0) goto LAB_00142f76;
    testing::Message::Message(&local_58);
    if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
    }
    line = 0xd4;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_40,&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if ((long *)CONCAT44(local_58.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_58.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_58.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_58.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
LAB_00142f76:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_50._9_7_,local_50[8]) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_50._9_7_,local_50[8]));
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_38);
  return;
}

Assistant:

TEST_F(CircularArrayTest, const_front) {
  CircularArray<TestObject, 2> ca;
  const auto& cca = ca;

  ca.push_back(TestObject(1));
  ASSERT_EQ(1, cca.front().data);

  ca.push_back(TestObject(2));
  ASSERT_EQ(1, cca.front().data);
}